

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

ctmbstr prvTidytmbsubstr(ctmbstr s1,ctmbstr s2)

{
  uint uVar1;
  uint n;
  int iVar2;
  ctmbstr s1_00;
  long lVar3;
  
  uVar1 = prvTidytmbstrlen(s1);
  n = prvTidytmbstrlen(s2);
  lVar3 = 0;
  do {
    s1_00 = s1;
    if ((int)(uVar1 - n) < lVar3) {
      return (ctmbstr)0x0;
    }
    iVar2 = prvTidytmbstrncasecmp(s1_00,s2,n);
    lVar3 = lVar3 + 1;
    s1 = s1_00 + 1;
  } while (iVar2 != 0);
  return s1_00;
}

Assistant:

ctmbstr TY_(tmbsubstr)( ctmbstr s1, ctmbstr s2 )
{
    uint len1 = TY_(tmbstrlen)(s1), len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncasecmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}